

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

void spvtools::val::UpdateContinueConstructExitBlocks
               (Function *function,
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *back_edges)

{
  uint32_t block_id;
  uint32_t uVar1;
  pointer ppVar2;
  Construct *this;
  ConstructType CVar3;
  _List_node_base *p_Var4;
  BasicBlock *pBVar5;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *pvVar6;
  _List_node_base *p_Var7;
  pair<spvtools::val::BasicBlock_*,_bool> pVar8;
  Construct construct;
  pointer local_80;
  Construct local_60;
  
  p_Var4 = (_List_node_base *)Function::constructs_abi_cxx11_(function);
  local_80 = (back_edges->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (local_80 != ppVar2) {
    do {
      p_Var7 = p_Var4->_M_next;
      if (p_Var7 != p_Var4) {
        block_id = local_80->first;
        uVar1 = local_80->second;
        do {
          local_60.type_ = *(ConstructType *)&p_Var7[1]._M_next;
          std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
          vector(&local_60.corresponding_constructs_,
                 (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
                 &p_Var7[1]._M_prev);
          local_60.entry_block_ = (BasicBlock *)p_Var7[3]._M_next;
          local_60.exit_block_ = (BasicBlock *)p_Var7[3]._M_prev;
          CVar3 = Construct::type(&local_60);
          if (CVar3 == kLoop) {
            pBVar5 = Construct::entry_block(&local_60);
            if (pBVar5->id_ == uVar1) {
              pvVar6 = Construct::corresponding_constructs(&local_60);
              this = (pvVar6->
                     super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1];
              CVar3 = Construct::type(this);
              if (CVar3 != kContinue) {
                __assert_fail("continue_construct->type() == ConstructType::kContinue",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp"
                              ,0x198,
                              "void spvtools::val::UpdateContinueConstructExitBlocks(Function &, const std::vector<std::pair<uint32_t, uint32_t>> &)"
                             );
              }
              pVar8 = Function::GetBlock(function,block_id);
              Construct::set_exit(this,pVar8.first);
            }
          }
          if (local_60.corresponding_constructs_.
              super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.corresponding_constructs_.
                            super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.corresponding_constructs_.
                                  super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.corresponding_constructs_.
                                  super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          p_Var7 = (((_List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
                      *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        } while (p_Var7 != p_Var4);
      }
      local_80 = local_80 + 1;
    } while (local_80 != ppVar2);
  }
  return;
}

Assistant:

void UpdateContinueConstructExitBlocks(
    Function& function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges) {
  auto& constructs = function.constructs();
  // TODO(umar): Think of a faster way to do this
  for (auto& edge : back_edges) {
    uint32_t back_edge_block_id;
    uint32_t loop_header_block_id;
    std::tie(back_edge_block_id, loop_header_block_id) = edge;
    auto is_this_header = [=](Construct& c) {
      return c.type() == ConstructType::kLoop &&
             c.entry_block()->id() == loop_header_block_id;
    };

    for (auto construct : constructs) {
      if (is_this_header(construct)) {
        Construct* continue_construct =
            construct.corresponding_constructs().back();
        assert(continue_construct->type() == ConstructType::kContinue);

        BasicBlock* back_edge_block;
        std::tie(back_edge_block, std::ignore) =
            function.GetBlock(back_edge_block_id);
        continue_construct->set_exit(back_edge_block);
      }
    }
  }
}